

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::TemplatedFetchRow<float>
               (transaction_t start_time,transaction_t transaction_id,UpdateInfo *info,idx_t row_idx
               ,Vector *result,idx_t result_idx)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  long lVar3;
  ulong uVar4;
  UndoBufferPointer update_ptr;
  UndoBufferPointer local_68;
  UndoBufferReference local_58;
  
  pdVar1 = result->data;
  if (((start_time < (info->version_number).super___atomic_base<unsigned_long>._M_i) &&
      ((info->version_number).super___atomic_base<unsigned_long>._M_i != transaction_id)) &&
     ((ulong)info->N != 0)) {
    lVar3 = 0x12;
    while( true ) {
      uVar4 = (ulong)*(uint *)((long)&info->segment + lVar3 * 4);
      if (uVar4 == row_idx) break;
      if ((row_idx <= uVar4 && uVar4 != row_idx) ||
         (uVar4 = lVar3 - 0x11, lVar3 = lVar3 + 1, info->N <= uVar4)) goto LAB_010f9ca4;
    }
    *(undefined4 *)(pdVar1 + result_idx * 4) =
         *(undefined4 *)((long)&info->segment + lVar3 * 4 + (ulong)info->max * 4);
  }
LAB_010f9ca4:
  local_68.entry = (info->next).entry;
  local_68.position = (info->next).position;
  if (local_68.entry != (UndoBufferEntry *)0x0) {
    do {
      UndoBufferPointer::Pin(&local_58,&local_68);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_58.handle.node);
      pdVar2 = (local_58.handle.node.ptr)->buffer;
      if (((start_time < *(ulong *)(pdVar2 + local_58.position + 0x10)) &&
          (*(transaction_t *)(pdVar2 + local_58.position + 0x10) != transaction_id)) &&
         ((ulong)*(uint *)(pdVar2 + local_58.position + 0x20) != 0)) {
        lVar3 = 0x12;
        while( true ) {
          uVar4 = (ulong)*(uint *)(pdVar2 + lVar3 * 4 + local_58.position);
          if (uVar4 == row_idx) break;
          if ((row_idx <= uVar4 && uVar4 != row_idx) ||
             (uVar4 = lVar3 - 0x11, lVar3 = lVar3 + 1,
             *(uint *)(pdVar2 + local_58.position + 0x20) <= uVar4)) goto LAB_010f9d50;
        }
        *(undefined4 *)(pdVar1 + result_idx * 4) =
             *(undefined4 *)
              (pdVar2 + lVar3 * 4 +
                        local_58.position + (ulong)*(uint *)(pdVar2 + local_58.position + 0x24) * 4)
        ;
      }
LAB_010f9d50:
      local_68.entry = *(UndoBufferEntry **)(pdVar2 + local_58.position + 0x38);
      local_68.position = *(idx_t *)(pdVar2 + local_58.position + 0x40);
      BufferHandle::~BufferHandle(&local_58.handle);
    } while (local_68.entry != (UndoBufferEntry *)0x0);
  }
  return;
}

Assistant:

static void TemplatedFetchRow(transaction_t start_time, transaction_t transaction_id, UpdateInfo &info, idx_t row_idx,
                              Vector &result, idx_t result_idx) {
	auto result_data = FlatVector::GetData<T>(result);
	UpdateInfo::UpdatesForTransaction(info, start_time, transaction_id, [&](UpdateInfo &current) {
		auto info_data = current.GetData<T>();
		auto tuples = current.GetTuples();
		// FIXME: we could do a binary search in here
		for (idx_t i = 0; i < current.N; i++) {
			if (tuples[i] == row_idx) {
				result_data[result_idx] = info_data[i];
				break;
			} else if (tuples[i] > row_idx) {
				break;
			}
		}
	});
}